

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

JitTypePropertyGuard * __thiscall
Lowerer::CreateTypePropertyGuardForGuardedProperties
          (Lowerer *this,JITTypeHolder type,PropertySymOpnd *propertySymOpnd)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  Func *this_00;
  code *pcVar2;
  int iVar3;
  Lowerer *pLVar4;
  bool bVar5;
  uint id;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  FunctionJITTimeInfo *pFVar9;
  ObjTypeSpecFldInfo *this_01;
  JITType *this_02;
  intptr_t typeAddr;
  JitTypePropertyGuard *pJVar10;
  JITTimeFunctionBody *pJVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  Lowerer *pLVar14;
  ulong uVar15;
  Type_conflict pBVar16;
  ulong uVar17;
  uint local_e8 [24];
  ulong local_88;
  Phases *local_80;
  Lowerer *local_78;
  JITTypeHolderBase<void> local_70;
  JitTypePropertyGuard **local_68;
  JitTypePropertyGuard *local_60;
  JitTypePropertyGuard *guard;
  undefined4 *local_50;
  Type_conflict local_48;
  uint local_3c;
  Lowerer *local_38;
  
  if (propertySymOpnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ee7,"(propertySymOpnd->GetGuardedPropOps() != nullptr)",
                       "propertySymOpnd->GetGuardedPropOps() != nullptr");
    if (!bVar5) goto LAB_005cdeec;
    *puVar8 = 0;
  }
  local_60 = (JitTypePropertyGuard *)0x0;
  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  bVar5 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar9);
  if (bVar5) {
    pBVar1 = propertySymOpnd->guardedPropOps;
    local_68 = &local_60;
    local_78 = this;
    local_70.t = type.t;
    local_38 = this;
    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    bVar5 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar9);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1fd8,
                         "(this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())"
                         ,"this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards()"
                        );
      if (!bVar5) goto LAB_005cdeec;
      *puVar8 = 0;
    }
    if (pBVar1 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1fd9,"(guardedPropOps != nullptr)","guardedPropOps != nullptr");
      if (!bVar5) {
LAB_005cdeec:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    pLVar14 = local_38;
    pBVar16 = pBVar1->head;
    if (pBVar16 != (Type_conflict)0x0) {
      local_50 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      local_80 = (Phases *)&DAT_015aabd0;
      guard = (JitTypePropertyGuard *)&DAT_015b6718;
      do {
        uVar17 = (pBVar16->data).word;
        local_48 = pBVar16;
        if (uVar17 != 0) {
          local_88 = (ulong)pBVar16->startIndex;
          uVar15 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          do {
            iVar3 = (int)local_88;
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar15);
            this_01 = Func::GetGlobalObjTypeSpecFldInfo(pLVar14->m_func,iVar3 + (BVIndex)uVar15);
            id = ObjTypeSpecFldInfo::GetPropertyId(this_01);
            bVar5 = ObjTypeSpecFldInfo::IsBeingAdded(this_01);
            if (((bVar5) || (bVar5 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), bVar5)) ||
               (bVar5 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar5)) {
              bVar5 = ObjTypeSpecFldInfo::IsPoly(this_01);
              if (((bVar5) && (bVar5 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar5)) &&
                 ((bVar5 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), !bVar5 &&
                  (bVar5 = ObjTypeSpecFldInfo::UsesAccessor(this_01), !bVar5)))) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar8 = local_50;
                *local_50 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x1fee,
                                   "(!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor()))"
                                   ,
                                   "!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor())"
                                  );
                if (!bVar5) goto LAB_005cdeec;
                *puVar8 = 0;
              }
              pFVar9 = JITTimeWorkItem::GetJITTimeInfo(pLVar14->m_func->m_workItem);
              bVar5 = FunctionJITTimeInfo::HasSharedPropertyGuard(pFVar9,id);
              pLVar4 = local_78;
              if (bVar5) {
                local_3c = id;
                bVar5 = Func::ShouldDoLazyBailOut(local_78->m_func);
                if ((bVar5) &&
                   (bVar5 = Js::Phases::IsEnabled(local_80,LazyFixedTypeBailoutPhase), bVar5)) {
                  local_e8[0] = id;
                  JsUtil::
                  BaseDictionary<int,int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                  ::
                  Insert<(JsUtil::BaseDictionary<int,int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                            ((BaseDictionary<int,int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                              *)&pLVar4->m_func->lazyBailoutProperties,(int *)local_e8,
                             (int *)&local_3c);
                  pLVar14 = local_38;
                }
                else {
                  if (*local_68 == (JitTypePropertyGuard *)0x0) {
                    this_00 = pLVar4->m_func;
                    this_02 = JITTypeHolderBase<void>::operator->(&local_70);
                    typeAddr = JITType::GetAddr(this_02);
                    pJVar10 = Func::GetOrCreateSingleTypeGuard(this_00,typeAddr);
                    *local_68 = pJVar10;
                  }
                  pJVar11 = JITTimeWorkItem::GetJITFunctionBody(pLVar4->m_func->m_workItem);
                  uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
                  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(pLVar4->m_func->m_workItem);
                  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
                  bVar5 = Js::Phases::IsEnabled((Phases *)guard,ObjTypeSpecPhase,uVar6,uVar7);
                  if (bVar5) {
LAB_005cde3e:
                    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(pLVar4->m_func->m_workItem);
                    pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(pLVar4->m_func->m_workItem);
                    pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (pFVar9,(wchar (*) [42])local_e8);
                    Output::Print(L"ObjTypeSpec: function %s(%s) registered guard 0x%p with value 0x%p for property ID %u.\n"
                                  ,pcVar12,pcVar13,*local_68,
                                  ((*local_68)->super_JitIndexedPropertyGuard).super_PropertyGuard.
                                  value,(ulong)id);
                    Output::Flush();
                  }
                  else {
                    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(pLVar4->m_func->m_workItem);
                    uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
                    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(pLVar4->m_func->m_workItem);
                    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
                    bVar5 = Js::Phases::IsEnabled
                                      ((Phases *)guard,TracePropertyGuardsPhase,uVar6,uVar7);
                    if (bVar5) goto LAB_005cde3e;
                  }
                  Func::EnsurePropertyGuardsByPropertyId(pLVar4->m_func);
                  Func::LinkGuardToPropertyId
                            (pLVar4->m_func,id,&(*local_68)->super_JitIndexedPropertyGuard);
                  pLVar14 = local_38;
                }
              }
              else {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar8 = local_50;
                *local_50 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x1ff7,"(false)",
                                   "Did we fail to create a shared property guard for a guarded property?"
                                  );
                if (!bVar5) goto LAB_005cdeec;
                *puVar8 = 0;
              }
            }
            uVar17 = uVar17 & ~(1L << (uVar15 & 0x3f));
            uVar15 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
          } while (uVar17 != 0);
        }
        pBVar16 = local_48->next;
      } while (pBVar16 != (Type)0x0);
    }
  }
  else {
    local_60 = (JitTypePropertyGuard *)0x0;
  }
  return local_60;
}

Assistant:

Js::JitTypePropertyGuard*
Lowerer::CreateTypePropertyGuardForGuardedProperties(JITTypeHolder type, IR::PropertySymOpnd* propertySymOpnd)
{
    // We should always have a list of guarded properties.
    Assert(propertySymOpnd->GetGuardedPropOps() != nullptr);

    Js::JitTypePropertyGuard* guard = nullptr;

    if (m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        // Consider (ObjTypeSpec): Because we allocate these guards from the JIT thread we can't share guards for the same type across multiple functions.
        // This leads to proliferation of property guards on the thread context.  The alternative would be to pre-allocate shared (by value) guards
        // from the thread context during work item creation.  We would create too many of them (because some types aren't actually used as guards),
        // but we could share a guard for a given type between functions.  This may ultimately be better.

        LinkGuardToGuardedProperties(propertySymOpnd->GetGuardedPropOps(), [this, type, &guard](Js::PropertyId propertyId)
        {
            if (ShouldDoLazyFixedTypeBailout(this->m_func))
            {
                this->m_func->lazyBailoutProperties.Item(propertyId);
            }
            else
            {
                if (guard == nullptr)
                {
                    guard = this->m_func->GetOrCreateSingleTypeGuard(type->GetAddr());
                }

                if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("ObjTypeSpec: function %s(%s) registered guard 0x%p with value 0x%p for property ID %u.\n"),
                        m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                        guard, guard->GetValue(), propertyId);
                    Output::Flush();
                }

                this->m_func->EnsurePropertyGuardsByPropertyId();
                this->m_func->LinkGuardToPropertyId(propertyId, guard);
            }
        });
    }

    return guard;
}